

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  _Bool _Var1;
  int iVar2;
  char **argv_local;
  int argc_local;
  
  argp_parse(&arg_def,argc,argv,0,0,&prog_arg);
  init_global_cfg();
  _Var1 = cfg_loadf(prog_arg.config_file,app_cfg_items);
  if (_Var1) {
    _Var1 = cdns_validate_cfg();
    if (_Var1) {
      iVar2 = log_preopen("cdns",g_app_cfg.log,(_Bool)(g_app_cfg.log_debug & 1),
                          (_Bool)(g_app_cfg.log_info & 1));
      if (iVar2 == 0) {
        log_open();
        if (((g_app_cfg.daemon & 1U) == 0) || (iVar2 = daemon(1,0), iVar2 == 0)) {
          if (g_app_cfg.pidfile != (char *)0x0) {
            write_pidfile(g_app_cfg.pidfile);
          }
          start_server();
          argv_local._4_4_ = 0;
        }
        else {
          _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/main.c",
                     0xa0,"main",1,3,"daemon");
          argv_local._4_4_ = -1;
        }
      }
      else {
        fprintf(_stderr,"Failed to set up logging.\n");
        argv_local._4_4_ = -1;
      }
    }
    else {
      argv_local._4_4_ = -1;
    }
  }
  else {
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

int main (int argc, char * argv[])
{
    /* Handle arguments */
    argp_parse (&arg_def, argc, argv, 0, 0, &prog_arg);

    /* init globals */
    init_global_cfg();

    /* Load configurations */
    if (!cfg_loadf(prog_arg.config_file, &app_cfg_items[0]))
        return -1;

    /* Verify configurations */
    if (!cdns_validate_cfg())
        return -1;

    /* Setup logging */
    if (log_preopen("cdns", g_app_cfg.log, g_app_cfg.log_debug, g_app_cfg.log_info)) {
        fprintf(stderr, "Failed to set up logging.\n");
        return -1; 
    } 
    log_open();

    if (g_app_cfg.daemon) {
        if (daemon(1, 0)) {
            log_errno(LOG_ERR, "daemon");
            return -1;
        }
    }
    if (g_app_cfg.pidfile)
        write_pidfile(g_app_cfg.pidfile);
        
    /* Start serving */    
    start_server(); 

    /* Clean up before exit */
    return 0;
}